

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

RegEx * YAML::Exp::EscBreak(void)

{
  int iVar1;
  RegEx *ex2;
  RegEx RStack_28;
  
  if (EscBreak()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&EscBreak()::e);
    if (iVar1 != 0) {
      RegEx::RegEx(&RStack_28,'\\');
      ex2 = Break();
      operator+(&EscBreak::e,&RStack_28,ex2);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&RStack_28.m_params);
      __cxa_atexit(RegEx::~RegEx,&EscBreak::e,&__dso_handle);
      __cxa_guard_release(&EscBreak()::e);
    }
  }
  return &EscBreak::e;
}

Assistant:

inline const RegEx& EscBreak() {
  static const RegEx e = RegEx('\\') + Break();
  return e;
}